

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O1

state_status_t
tchecker::zg::final(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,zone_sptr_t *zone,
                   vedge_sptr_t *vedge,sync_id_t *sync_id,clock_constraint_container_t *invariant,
                   semantics_t *semantics,extrapolation_t *extrapolation,final_value_t *final_range)

{
  uint uVar1;
  bool bVar2;
  state_status_t sVar3;
  db_t *pdVar4;
  
  sVar3 = ta::final(system,vloc,intval,vedge,sync_id,invariant,final_range);
  if (sVar3 != 1) {
    return sVar3;
  }
  if (&zone->_t->super_zone_t != (zone_t *)0x0) {
    pdVar4 = zone_t::dbm(&zone->_t->super_zone_t);
    if (zone->_t != (make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *)0x0) {
      if (&vloc->_t->super_vloc_t == (vloc_t *)0x0) {
LAB_0017011f:
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1d0,
                      "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
                     );
      }
      uVar1 = (zone->_t->super_zone_t)._dim;
      bVar2 = ta::delay_allowed(system,&vloc->_t->super_vloc_t);
      sVar3 = (*semantics->_vptr_semantics_t[3])
                        (semantics,pdVar4,(ulong)uVar1,(ulong)bVar2,invariant);
      if (sVar3 == 1) {
        if (vloc->_t == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0)
        goto LAB_0017011f;
        (*extrapolation->_vptr_extrapolation_t[2])(extrapolation,pdVar4,(ulong)uVar1);
        sVar3 = 1;
      }
      return sVar3;
    }
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::zg::zone_t>]"
               );
}

Assistant:

tchecker::state_status_t final(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                               tchecker::intval_sptr_t const & intval, tchecker::zg::zone_sptr_t const & zone,
                               tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                               tchecker::clock_constraint_container_t & invariant, tchecker::zg::semantics_t & semantics,
                               tchecker::zg::extrapolation_t & extrapolation, tchecker::zg::final_value_t const & final_range)
{
  tchecker::state_status_t status = tchecker::ta::final(system, vloc, intval, vedge, sync_id, invariant, final_range);
  if (status != tchecker::STATE_OK)
    return status;

  tchecker::dbm::db_t * dbm = zone->dbm();
  tchecker::clock_id_t dim = zone->dim();
  bool delay_allowed = tchecker::ta::delay_allowed(system, *vloc);

  status = semantics.final(dbm, dim, delay_allowed, invariant);
  if (status != tchecker::STATE_OK)
    return status;

  extrapolation.extrapolate(dbm, dim, *vloc);

  return tchecker::STATE_OK;
}